

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

void __thiscall duckdb::StringValueResult::NullPaddingQuotedNewlineCheck(StringValueResult *this)

{
  string *in_R9;
  LinesPerBoundary error_info;
  LinesPerBoundary lines_per_batch;
  CSVError csv_error;
  LinesPerBoundary local_b0;
  CSVError local_a0;
  
  if (((((this->super_ScannerResult).state_machine)->options->null_padding == true) &&
      (this->iterator->is_set == true)) && (this->quoted_new_line == true)) {
    LinesPerBoundary::LinesPerBoundary
              (&local_b0,(this->iterator->boundary).boundary_idx,*this->lines_read);
    error_info.lines_in_batch = (idx_t)&this->path;
    error_info.boundary_idx = local_b0.lines_in_batch;
    CSVError::NullPaddingFail
              (&local_a0,(CSVError *)((this->super_ScannerResult).state_machine)->options,
               (CSVReaderOptions *)local_b0.boundary_idx,error_info,in_R9);
    CSVErrorHandler::Error(this->error_handler,&local_a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.csv_row._M_dataplus._M_p != &local_a0.csv_row.field_2) {
      operator_delete(local_a0.csv_row._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.full_error_message._M_dataplus._M_p != &local_a0.full_error_message.field_2) {
      operator_delete(local_a0.full_error_message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.error_message._M_dataplus._M_p != &local_a0.error_message.field_2) {
      operator_delete(local_a0.error_message._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void StringValueResult::NullPaddingQuotedNewlineCheck() const {
	// We do some checks for null_padding correctness
	if (state_machine.options.null_padding && iterator.IsBoundarySet() && quoted_new_line) {
		// If we have null_padding set, we found a quoted new line, we are scanning the file in parallel; We error.
		LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(), lines_read);
		auto csv_error = CSVError::NullPaddingFail(state_machine.options, lines_per_batch, path);
		error_handler.Error(csv_error);
	}
}